

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
Annotator_assignIdByAnyCellmlElement_Test::Annotator_assignIdByAnyCellmlElement_Test
          (Annotator_assignIdByAnyCellmlElement_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00170a10;
  return;
}

Assistant:

TEST(Annotator, assignIdByAnyCellmlElement)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringLotsOfDuplicateIds);

    annotator->setModel(model);

    auto item = annotator->item("duplicateId4", 3);

    EXPECT_EQ(size_t(7), annotator->itemCount("duplicateId4"));
    EXPECT_EQ("b4da55", annotator->assignId(item));
    EXPECT_EQ(size_t(6), annotator->itemCount("duplicateId4"));
}